

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O1

void __thiscall
vk::DebugReportRecorder::DebugReportRecorder
          (DebugReportRecorder *this,InstanceInterface *vki,VkInstance instance)

{
  Move<vk::Handle<(vk::HandleType)29>_> local_68;
  VkDebugReportCallbackCreateInfoEXT local_48;
  
  de::AppendList<vk::DebugReportMessage>::AppendList(&this->m_messages,0x400);
  local_48.sType = VK_STRUCTURE_TYPE_DEBUG_REPORT_CALLBACK_CREATE_INFO_EXT;
  local_48.pNext = (void *)0x0;
  local_48.flags = 0x1f;
  local_48.pfnCallback = vk::anon_unknown_0::debugReportCallback;
  local_48.pUserData = this;
  createDebugReportCallbackEXT(&local_68,vki,instance,&local_48,(VkAllocationCallbacks *)0x0);
  (this->m_callback).super_RefBase<vk::Handle<(vk::HandleType)29>_>.m_data.deleter.m_instance =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)29>_>.m_data.deleter.m_instance;
  (this->m_callback).super_RefBase<vk::Handle<(vk::HandleType)29>_>.m_data.deleter.m_allocator =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)29>_>.m_data.deleter.m_allocator;
  (this->m_callback).super_RefBase<vk::Handle<(vk::HandleType)29>_>.m_data.object.m_internal =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)29>_>.m_data.object.m_internal;
  (this->m_callback).super_RefBase<vk::Handle<(vk::HandleType)29>_>.m_data.deleter.m_instanceIface =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)29>_>.m_data.deleter.m_instanceIface;
  return;
}

Assistant:

DebugReportRecorder::DebugReportRecorder (const InstanceInterface& vki, VkInstance instance)
	: m_messages	(1024)
	, m_callback	(createCallback(vki, instance, &m_messages))
{
}